

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astUseNamedSlotsOfNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  anon_struct_40_5_60240bed gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameRecord_t local_38;
  undefined8 local_28;
  undefined1 *local_20;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  gcFrame.localBinding = 0;
  gcFrame.literalVoid = 0;
  gcFrame.useNode = (sysbvm_astUseNamedSlotsOfNode_t *)0x0;
  gcFrame.analyzedTupleNode = 0;
  gcFrame.value = 0;
  local_38.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_38.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_38._12_4_ = 0;
  local_28 = 5;
  local_20 = (undefined1 *)&gcFrame;
  sysbvm_stackFrame_pushRecord(&local_38);
  gcFrame.useNode =
       (sysbvm_astUseNamedSlotsOfNode_t *)sysbvm_context_shallowCopy(context,*arguments);
  sVar2 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
  ((gcFrame.useNode)->super).analyzerToken = sVar2;
  ((gcFrame.useNode)->super).analyzedType = (context->roots).voidType;
  sourcePositionRecord.previous = (sysbvm_stackFrameRecord_t *)0x0;
  sourcePositionRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  sourcePositionRecord.sourcePosition = ((gcFrame.useNode)->super).sourcePosition;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  gcFrame.analyzedTupleNode =
       sysbvm_interpreter_analyzeASTWithReceiverTypeWithEnvironment
                 (context,(gcFrame.useNode)->tupleExpression,arguments[1]);
  (gcFrame.useNode)->tupleExpression = gcFrame.analyzedTupleNode;
  _Var1 = sysbvm_astNode_isLiteralNode(context,gcFrame.analyzedTupleNode);
  if (_Var1) {
    gcFrame.value = sysbvm_astLiteralNode_getValue(gcFrame.analyzedTupleNode);
    gcFrame.localBinding =
         sysbvm_analysisEnvironment_setNewValueBinding
                   (context,arguments[1],((gcFrame.useNode)->super).sourcePosition,0,gcFrame.value);
    gcFrame.literalVoid =
         sysbvm_astLiteralNode_create(context,((gcFrame.useNode)->super).sourcePosition,0x2f);
    sysbvm_analysisAndEvaluationEnvironment_addUseTupleWithNamedSlotsBinding
              (context,arguments[1],gcFrame.localBinding);
  }
  else {
    if ((gcFrame.analyzedTupleNode & 0xf) == 0 && gcFrame.analyzedTupleNode != 0) {
      sVar2 = *(sysbvm_tuple_t *)(gcFrame.analyzedTupleNode + 0x20);
    }
    else {
      sVar2 = 0;
    }
    gcFrame.localBinding =
         sysbvm_analysisEnvironment_setNewSymbolLocalBinding
                   (context,arguments[1],((gcFrame.useNode)->super).sourcePosition,0,sVar2);
    sysbvm_analysisAndEvaluationEnvironment_addUseTupleWithNamedSlotsBinding
              (context,arguments[1],gcFrame.localBinding);
    (gcFrame.useNode)->binding = gcFrame.localBinding;
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  sysbvm_stackFrame_popRecord(&local_38);
  return (sysbvm_tuple_t)gcFrame.useNode;
}

Assistant:

static sysbvm_tuple_t sysbvm_astUseNamedSlotsOfNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astUseNamedSlotsOfNode_t *useNode;
        sysbvm_tuple_t analyzedTupleNode;
        sysbvm_tuple_t localBinding;
        sysbvm_tuple_t literalVoid;
        sysbvm_tuple_t value;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.useNode = (sysbvm_astUseNamedSlotsOfNode_t*)sysbvm_context_shallowCopy(context, *node);
    gcFrame.useNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);
    gcFrame.useNode->super.analyzedType = context->roots.voidType;
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.useNode->super.sourcePosition);

    gcFrame.analyzedTupleNode = sysbvm_interpreter_analyzeASTWithReceiverTypeWithEnvironment(context, gcFrame.useNode->tupleExpression, *environment);
    gcFrame.useNode->tupleExpression = gcFrame.analyzedTupleNode;

    if(sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedTupleNode))
    {
        gcFrame.value = sysbvm_astLiteralNode_getValue(gcFrame.analyzedTupleNode);
        gcFrame.localBinding = sysbvm_analysisEnvironment_setNewValueBinding(context, *environment, gcFrame.useNode->super.sourcePosition, SYSBVM_NULL_TUPLE, gcFrame.value);
        gcFrame.literalVoid = sysbvm_astLiteralNode_create(context, gcFrame.useNode->super.sourcePosition, SYSBVM_VOID_TUPLE);
        sysbvm_analysisAndEvaluationEnvironment_addUseTupleWithNamedSlotsBinding(context, *environment, gcFrame.localBinding);

        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return (sysbvm_tuple_t)gcFrame.useNode;
    }
    else
    {
        gcFrame.localBinding = sysbvm_analysisEnvironment_setNewSymbolLocalBinding(context, *environment, gcFrame.useNode->super.sourcePosition, SYSBVM_NULL_TUPLE, sysbvm_astNode_getAnalyzedType(gcFrame.analyzedTupleNode));
        sysbvm_analysisAndEvaluationEnvironment_addUseTupleWithNamedSlotsBinding(context, *environment, gcFrame.localBinding);
        gcFrame.useNode->binding = gcFrame.localBinding;
    }

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.useNode;
}